

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_trie.c
# Opt level: O2

void trie_node_iterate(trie t,trie_node n,trie_cb_iterate iterate_cb,trie_cb_iterate_args args)

{
  long lVar1;
  int iVar2;
  vector v;
  size_t sVar3;
  long *plVar4;
  set_value pvVar5;
  trie_node back;
  set_iterator it;
  trie_cb_iterate_args local_48;
  trie_node current_node;
  trie_node n_local;
  
  if (iterate_cb != (trie_cb_iterate)0x0 && (n != (trie_node)0x0 && t != (trie)0x0)) {
    local_48 = args;
    n_local = n;
    v = vector_create(8);
    vector_push_back(v,&n_local);
    while( true ) {
      sVar3 = vector_size(v);
      if (sVar3 == 0) break;
      plVar4 = (long *)vector_back(v);
      vector_pop_back(v);
      if ((plVar4 != (long *)0x0) && (lVar1 = *plVar4, lVar1 != 0)) {
        if (*(set *)(lVar1 + 0x20) != (set)0x0) {
          it = set_iterator_begin(*(set *)(lVar1 + 0x20));
          while( true ) {
            iVar2 = set_iterator_end(&it);
            if (iVar2 < 1) break;
            pvVar5 = set_iterator_get_value(it);
            current_node = t->node_list + *(long *)((long)pvVar5 + 8);
            vector_push_back(v,&current_node);
            set_iterator_next(it);
          }
        }
        (*iterate_cb)(t,*(trie_key *)(lVar1 + 0x10),*(trie_value *)(lVar1 + 0x18),local_48);
      }
    }
    vector_destroy(v);
  }
  return;
}

Assistant:

void trie_node_iterate(trie t, trie_node n, trie_cb_iterate iterate_cb, trie_cb_iterate_args args)
{
	if (t != NULL && n != NULL && iterate_cb != NULL)
	{
		vector node_stack = vector_create(sizeof(trie_node));

		vector_push_back(node_stack, &n);

		while (vector_size(node_stack) > 0)
		{
			trie_node *back_ptr = vector_back(node_stack);

			vector_pop_back(node_stack);

			if (back_ptr != NULL && *back_ptr != NULL)
			{
				trie_node back = *back_ptr;

				if (back->childs != NULL)
				{
					set_iterator it;
					for (it = set_iterator_begin(back->childs); set_iterator_end(&it) > 0; set_iterator_next(it))
					{
						trie_node_ref ref_node = set_iterator_get_value(it);

						trie_node current_node = &t->node_list[ref_node->index];

						vector_push_back(node_stack, &current_node);
					}
				}

				iterate_cb(t, back->key, back->value, args);
			}
		}

		vector_destroy(node_stack);
	}
}